

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid_Iterator_Face.cpp
# Opt level: O0

void __thiscall
Nova::Grid_Iterator_Face<float,_1>::Reset_Axis(Grid_Iterator_Face<float,_1> *this,int axis_input)

{
  T_Region TVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  bool bVar6;
  Range<int,_1> local_58;
  Range<int,_1> domain_copy_5;
  Range<int,_1> domain_copy_4;
  Range<int,_1> domain_copy_3;
  Range<int,_1> domain_copy_2;
  int axis_of_side_1;
  Range<int,_1> domain_copy_1;
  Range<int,_1> domain_copy;
  int axis_of_side;
  int side_iterator;
  Range<int,_1> domain;
  int axis_input_local;
  Grid_Iterator_Face<float,_1> *this_local;
  
  this->axis = axis_input;
  domain.min_corner._data._M_elems[0] = (T_STORAGE)(T_STORAGE)axis_input;
  unique0x10000651 = this;
  Grid_Iterator<float,_1>::Reset_Regions(&this->super_Grid_Iterator<float,_1>);
  Grid<float,_1>::Cell_Indices
            ((Grid<float,_1> *)&axis_of_side,(int)(this->super_Grid_Iterator<float,_1>).grid);
  TVar1 = this->region_type;
  if (TVar1 == Whole_Region) {
    if (this->side != 0) {
      __assert_fail("!side",
                    "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Face.cpp"
                    ,0x31,
                    "void Nova::Grid_Iterator_Face<float, 1>::Reset_Axis(const int) [T = float, d = 1]"
                   );
    }
    piVar5 = Vector<int,_1,_true>::operator()((Vector<int,_1,_true> *)&side_iterator,this->axis);
    *piVar5 = *piVar5 + 1;
    Grid_Iterator<float,_1>::Add_Region
              (&this->super_Grid_Iterator<float,_1>,(Range<int,_1> *)&axis_of_side);
  }
  else if (TVar1 == Ghost_Region) {
    if (this->side == 0) {
      for (domain_copy.max_corner._data._M_elems[0] = (T_STORAGE)(_Type)0x1;
          (int)domain_copy.max_corner._data._M_elems[0] < 3;
          domain_copy.max_corner._data._M_elems[0] =
               (T_STORAGE)((int)domain_copy.max_corner._data._M_elems[0] + 1)) {
        iVar4 = ((int)domain_copy.max_corner._data._M_elems[0] + 1) / 2;
        if (((uint)domain_copy.max_corner._data._M_elems[0] & 1) != 0) {
          Range<int,_1>::Range(&domain_copy_1,(Range<int,_1> *)&axis_of_side);
          piVar5 = Vector<int,_1,_true>::operator()(&domain_copy_1.max_corner,this->axis);
          *piVar5 = *piVar5 + 1;
          piVar5 = Vector<int,_1,_true>::operator()(&domain_copy_1.min_corner,iVar4 + -1);
          iVar2 = *piVar5;
          iVar3 = this->number_of_ghost_cells;
          piVar5 = Vector<int,_1,_true>::operator()(&domain_copy_1.max_corner,iVar4 + -1);
          *piVar5 = iVar2 + iVar3 + -1;
          Grid_Iterator<float,_1>::Add_Region(&this->super_Grid_Iterator<float,_1>,&domain_copy_1);
        }
        if (((uint)domain_copy.max_corner._data._M_elems[0] & 1) == 0) {
          Range<int,_1>::Range
                    ((Range<int,_1> *)&domain_copy_2.max_corner,(Range<int,_1> *)&axis_of_side);
          piVar5 = Vector<int,_1,_true>::operator()
                             ((Vector<int,_1,_true> *)&axis_of_side_1,this->axis);
          *piVar5 = *piVar5 + 1;
          piVar5 = Vector<int,_1,_true>::operator()
                             ((Vector<int,_1,_true> *)&axis_of_side_1,iVar4 + -1);
          iVar2 = *piVar5;
          iVar3 = this->number_of_ghost_cells;
          piVar5 = Vector<int,_1,_true>::operator()(&domain_copy_2.max_corner,iVar4 + -1);
          *piVar5 = (iVar2 - iVar3) + 1;
          Grid_Iterator<float,_1>::Add_Region
                    (&this->super_Grid_Iterator<float,_1>,(Range<int,_1> *)&domain_copy_2.max_corner
                    );
        }
      }
    }
    else {
      domain_copy_2.min_corner._data._M_elems[0] = (T_STORAGE)((this->side + 1) / 2);
      if ((this->side & 1U) != 0) {
        Range<int,_1>::Range(&domain_copy_3,(Range<int,_1> *)&axis_of_side);
        piVar5 = Vector<int,_1,_true>::operator()(&domain_copy_3.max_corner,this->axis);
        *piVar5 = *piVar5 + 1;
        piVar5 = Vector<int,_1,_true>::operator()
                           (&domain_copy_3.min_corner,
                            (int)domain_copy_2.min_corner._data._M_elems[0] + -1);
        iVar4 = *piVar5;
        iVar2 = this->number_of_ghost_cells;
        piVar5 = Vector<int,_1,_true>::operator()
                           (&domain_copy_3.max_corner,
                            (int)domain_copy_2.min_corner._data._M_elems[0] + -1);
        *piVar5 = iVar4 + iVar2 + -1;
        Grid_Iterator<float,_1>::Add_Region(&this->super_Grid_Iterator<float,_1>,&domain_copy_3);
      }
      if ((this->side & 1U) == 0) {
        Range<int,_1>::Range(&domain_copy_4,(Range<int,_1> *)&axis_of_side);
        piVar5 = Vector<int,_1,_true>::operator()(&domain_copy_4.max_corner,this->axis);
        *piVar5 = *piVar5 + 1;
        piVar5 = Vector<int,_1,_true>::operator()
                           (&domain_copy_4.max_corner,
                            (int)domain_copy_2.min_corner._data._M_elems[0] + -1);
        iVar4 = *piVar5;
        iVar2 = this->number_of_ghost_cells;
        piVar5 = Vector<int,_1,_true>::operator()
                           (&domain_copy_4.min_corner,
                            (int)domain_copy_2.min_corner._data._M_elems[0] + -1);
        *piVar5 = (iVar4 - iVar2) + 1;
        Grid_Iterator<float,_1>::Add_Region(&this->super_Grid_Iterator<float,_1>,&domain_copy_4);
      }
    }
  }
  else if (TVar1 == Boundary_Region) {
    if ((this->side == 0) || ((this->side & 1U) != 0)) {
      Range<int,_1>::Range(&domain_copy_5,(Range<int,_1> *)&axis_of_side);
      piVar5 = Vector<int,_1,_true>::operator()((Vector<int,_1,_true> *)&axis_of_side,this->axis);
      iVar4 = *piVar5;
      piVar5 = Vector<int,_1,_true>::operator()(&domain_copy_5.max_corner,this->axis);
      *piVar5 = iVar4;
      Grid_Iterator<float,_1>::Add_Region(&this->super_Grid_Iterator<float,_1>,&domain_copy_5);
    }
    if ((this->side == 0) || ((this->side & 1U) == 0)) {
      Range<int,_1>::Range(&local_58,(Range<int,_1> *)&axis_of_side);
      piVar5 = Vector<int,_1,_true>::operator()((Vector<int,_1,_true> *)&side_iterator,this->axis);
      iVar4 = *piVar5;
      piVar5 = Vector<int,_1,_true>::operator()(&local_58.max_corner,this->axis);
      *piVar5 = iVar4 + 1;
      piVar5 = Vector<int,_1,_true>::operator()(&local_58.min_corner,this->axis);
      *piVar5 = iVar4 + 1;
      Grid_Iterator<float,_1>::Add_Region(&this->super_Grid_Iterator<float,_1>,&local_58);
    }
  }
  else {
    bVar6 = false;
    if (this->region_type == Interior_Region) {
      bVar6 = this->side == 0;
    }
    if (!bVar6) {
      __assert_fail("(region_type==Grid<T,d>::Interior_Region) && !side",
                    "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/src/Grids/Grid_Iterator_Face.cpp"
                    ,99,
                    "void Nova::Grid_Iterator_Face<float, 1>::Reset_Axis(const int) [T = float, d = 1]"
                   );
    }
    piVar5 = Vector<int,_1,_true>::operator()((Vector<int,_1,_true> *)&axis_of_side,this->axis);
    *piVar5 = *piVar5 + 1;
    Grid_Iterator<float,_1>::Add_Region
              (&this->super_Grid_Iterator<float,_1>,(Range<int,_1> *)&axis_of_side);
  }
  Grid_Iterator<float,_1>::Reset(&this->super_Grid_Iterator<float,_1>,0);
  return;
}

Assistant:

void Grid_Iterator_Face<T,d>::
Reset_Axis(const int axis_input)
{
    axis=axis_input;
    Reset_Regions();
    Range<int,d> domain(grid.Cell_Indices(number_of_ghost_cells));

    switch(region_type)
    {
        case Grid<T,d>::Whole_Region:       assert(!side);
                                            ++domain.max_corner(axis);
                                            Add_Region(domain);
                                            break;

        case Grid<T,d>::Ghost_Region:       if(!side)
                                            {
                                                for(int side_iterator=1;side_iterator<=2*d;++side_iterator){
                                                    int axis_of_side=(side_iterator+1)/2;
                                                    if(side_iterator&1){
                                                        Range<int,d> domain_copy(domain);
                                                        ++domain_copy.max_corner(axis);
                                                        domain_copy.max_corner(axis_of_side-1)=domain_copy.min_corner(axis_of_side-1)+number_of_ghost_cells-1;
                                                        Add_Region(domain_copy);}
                                                    if(!(side_iterator&1)){
                                                        Range<int,d> domain_copy(domain);
                                                        ++domain_copy.max_corner(axis);
                                                        domain_copy.min_corner(axis_of_side-1)=domain_copy.max_corner(axis_of_side-1)-number_of_ghost_cells+1;
                                                        Add_Region(domain_copy);}}
                                            }
                                            else
                                            {
                                                int axis_of_side=(side+1)/2;
                                                if(side&1){
                                                    Range<int,d> domain_copy(domain);
                                                    ++domain_copy.max_corner(axis);
                                                    domain_copy.max_corner(axis_of_side-1)=domain_copy.min_corner(axis_of_side-1)+number_of_ghost_cells-1;
                                                    Add_Region(domain_copy);}
                                                if(!(side&1)){
                                                    Range<int,d> domain_copy(domain);
                                                    ++domain_copy.max_corner(axis);
                                                    domain_copy.min_corner(axis_of_side-1)=domain_copy.max_corner(axis_of_side-1)-number_of_ghost_cells+1;
                                                    Add_Region(domain_copy);}
                                            }
                                            break;

        case Grid<T,d>::Boundary_Region:    if(!side || side&1)
                                            {
                                                Range<int,d> domain_copy(domain);
                                                domain_copy.max_corner(axis)=domain.min_corner(axis);
                                                Add_Region(domain_copy);
                                            }
                                            if(!side || !(side&1))
                                            {
                                                Range<int,d> domain_copy(domain);
                                                domain_copy.min_corner(axis)=domain_copy.max_corner(axis)=domain.max_corner(axis)+1;
                                                Add_Region(domain_copy);
                                            }
                                            break;

        default:                            assert((region_type==Grid<T,d>::Interior_Region) && !side);
                                            ++domain.min_corner(axis);
                                            Add_Region(domain);
                                            break;
    }
    Reset();
}